

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overlay.cpp
# Opt level: O1

void __thiscall r_exec::Overlay::unpatch_code(Overlay *this,uint16_t patch_index)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  ulong uVar3;
  pointer puVar4;
  undefined6 in_register_00000032;
  uint uVar5;
  
  uVar3 = CONCAT62(in_register_00000032,patch_index) & 0xffffffff;
  iVar1 = (*(this->controller->super__Object)._vptr__Object[4])();
  lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x20))
                    ((long *)CONCAT44(extraout_var,iVar1),0);
  puVar4 = (this->patch_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->patch_indices).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 1)) {
    uVar5 = (uint)CONCAT62(in_register_00000032,patch_index);
    do {
      uVar5 = uVar5 + 1;
      r_code::Atom::operator=
                (this->code + (ulong)puVar4[uVar3] * 4,(Atom *)(lVar2 + (ulong)puVar4[uVar3] * 4));
      uVar3 = (ulong)(uVar5 & 0xffff);
      puVar4 = (this->patch_indices).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->patch_indices).
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 1));
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->patch_indices,(ulong)patch_index);
  return;
}

Assistant:

void Overlay::unpatch_code(uint16_t patch_index)
{
    Code *object = get_core_object();
    Atom *original_code = &object->code(0);

    for (uint16_t i = patch_index; i < patch_indices.size(); ++i) {
        code[patch_indices[i]] = original_code[patch_indices[i]];
    }

    patch_indices.resize(patch_index);
}